

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_set_auxdata(sqlite3_context *pCtx,int iArg,void *pAux,_func_void_void_ptr *xDelete)

{
  AuxData *pAVar1;
  int local_44;
  int nMalloc;
  int nAux;
  VdbeFunc *pVdbeFunc;
  AuxData *pAuxData;
  _func_void_void_ptr *xDelete_local;
  void *pAux_local;
  int iArg_local;
  sqlite3_context *pCtx_local;
  
  if (iArg < 0) {
LAB_0017636f:
    if (xDelete != (_func_void_void_ptr *)0x0) {
      (*xDelete)(pAux);
    }
  }
  else {
    _nMalloc = pCtx->pVdbeFunc;
    if ((_nMalloc == (VdbeFunc *)0x0) || (_nMalloc->nAux <= iArg)) {
      if (_nMalloc == (VdbeFunc *)0x0) {
        local_44 = 0;
      }
      else {
        local_44 = _nMalloc->nAux;
      }
      _nMalloc = (VdbeFunc *)sqlite3DbRealloc((pCtx->s).db,_nMalloc,iArg * 0x10 + 0x20);
      if (_nMalloc == (VdbeFunc *)0x0) goto LAB_0017636f;
      pCtx->pVdbeFunc = _nMalloc;
      memset(_nMalloc->apAux + local_44,0,(long)((iArg + 1) - local_44) << 4);
      _nMalloc->nAux = iArg + 1;
      _nMalloc->pFunc = pCtx->pFunc;
    }
    pAVar1 = _nMalloc->apAux + iArg;
    if ((pAVar1->pAux != (void *)0x0) && (pAVar1->xDelete != (_func_void_void_ptr *)0x0)) {
      (*pAVar1->xDelete)(pAVar1->pAux);
    }
    pAVar1->pAux = pAux;
    pAVar1->xDelete = xDelete;
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_set_auxdata(
  sqlite3_context *pCtx, 
  int iArg, 
  void *pAux, 
  void (*xDelete)(void*)
){
  struct AuxData *pAuxData;
  VdbeFunc *pVdbeFunc;
  if( iArg<0 ) goto failed;

  assert( sqlite3_mutex_held(pCtx->s.db->mutex) );
  pVdbeFunc = pCtx->pVdbeFunc;
  if( !pVdbeFunc || pVdbeFunc->nAux<=iArg ){
    int nAux = (pVdbeFunc ? pVdbeFunc->nAux : 0);
    int nMalloc = sizeof(VdbeFunc) + sizeof(struct AuxData)*iArg;
    pVdbeFunc = sqlite3DbRealloc(pCtx->s.db, pVdbeFunc, nMalloc);
    if( !pVdbeFunc ){
      goto failed;
    }
    pCtx->pVdbeFunc = pVdbeFunc;
    memset(&pVdbeFunc->apAux[nAux], 0, sizeof(struct AuxData)*(iArg+1-nAux));
    pVdbeFunc->nAux = iArg+1;
    pVdbeFunc->pFunc = pCtx->pFunc;
  }

  pAuxData = &pVdbeFunc->apAux[iArg];
  if( pAuxData->pAux && pAuxData->xDelete ){
    pAuxData->xDelete(pAuxData->pAux);
  }
  pAuxData->pAux = pAux;
  pAuxData->xDelete = xDelete;
  return;

failed:
  if( xDelete ){
    xDelete(pAux);
  }
}